

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parameters.c
# Opt level: O0

CgreenVector * create_vector_of_double_markers_for(char *parameters)

{
  _Bool _Var1;
  CgreenVector *pCVar2;
  size_t sVar3;
  char *__s;
  char *__ptr;
  size_t sVar4;
  char *__s_00;
  char *in_RDI;
  int length_of_token;
  CgreenVector *markers;
  char *token;
  char *tokens;
  char *parameters_end;
  char *parameters_to_tokenize;
  CgreenVector *in_stack_ffffffffffffff98;
  CgreenVector *in_stack_ffffffffffffffa0;
  char *beginning;
  char *token_00;
  char *local_30;
  
  pCVar2 = create_cgreen_vector((_func_void_void_ptr *)in_stack_ffffffffffffffa0);
  if (((in_RDI != (char *)0x0) && (sVar3 = strlen(in_RDI), sVar3 != 0)) &&
     (__s = stringdup((char *)0x10ee1b), __s != (char *)0x0)) {
    sVar3 = strlen(__s);
    __ptr = tokenise_by_commas_and_whitespace((char *)in_stack_ffffffffffffffa0);
    local_30 = __ptr;
    while (beginning = __ptr, token_00 = local_30, sVar4 = strlen(in_RDI),
          token_00 < beginning + sVar4) {
      __s_00 = skip_nulls_until(local_30,__s + sVar3);
      sVar4 = strlen(__s_00);
      _Var1 = begins_with(token_00,beginning);
      if (_Var1) {
        in_stack_ffffffffffffffa0 = pCVar2;
        pointer_to_bool(SUB81((ulong)pCVar2 >> 0x38,0));
        cgreen_vector_add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        in_stack_ffffffffffffff98 = pCVar2;
        pointer_to_bool(SUB81((ulong)in_stack_ffffffffffffffa0 >> 0x38,0));
        cgreen_vector_add(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      strip_function_from(token_00,beginning);
      local_30 = strip_function_from(token_00,beginning);
      local_30 = local_30 + (int)sVar4;
    }
    free(__ptr);
  }
  return pCVar2;
}

Assistant:

CgreenVector *create_vector_of_double_markers_for(const char *parameters) {
    char *parameters_to_tokenize;
    char *parameters_end;
    char *tokens;
    char *token;
    CgreenVector *markers = create_cgreen_vector(&free);
    if ((parameters == NULL) || (strlen(parameters) == 0)) {
        return markers;
    }

    parameters_to_tokenize = stringdup(parameters);
    if (parameters_to_tokenize == NULL) {
        return markers;
    }

    parameters_end = parameters_to_tokenize + strlen(parameters_to_tokenize);
    tokens = tokenise_by_commas_and_whitespace(parameters_to_tokenize);
    token = tokens;
    while (token < tokens + strlen(parameters)) {
        token = skip_nulls_until(token, parameters_end);
        int length_of_token = strlen(token);
        if (begins_with(token, "box_double"))
            cgreen_vector_add(markers, pointer_to_bool(true));
        else
            cgreen_vector_add(markers, pointer_to_bool(false));
        token = strip_function_from(token, "box_double");
        token = strip_function_from(token, "d");
        token += length_of_token;
    }

    free(tokens);
    return markers;
}